

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Book *book)

{
  pointer pcVar1;
  ostream *poVar2;
  char local_91;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar1 = (book->title)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (book->title)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_50,local_48);
  local_70 = (long *)CONCAT71(local_70._1_7_,10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_70,1);
  pcVar1 = (book->author)._M_dataplus._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + (book->author)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
  local_90 = (long *)CONCAT71(local_90._1_7_,10);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_90,1);
  pcVar1 = (book->isbn)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (book->isbn)._M_string_length);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_90,local_88);
  local_91 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_91,1);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Book& book)
{
	os << book.get_title()
		<< '\n' << book.get_author()
		<< '\n' << book.get_isbn()
		<< '\n';
	return os;
}